

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding_x86_avx.cpp
# Opt level: O3

int __thiscall
ncnn::Padding_x86_avx::forward_int8
          (Padding_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  void *pvVar4;
  size_t sVar5;
  int *piVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  Mat *pMVar13;
  long lVar14;
  _func_int *p_Var15;
  ulong uVar16;
  Mat *pMVar17;
  undefined8 *puVar18;
  long lVar19;
  uint uVar20;
  int iVar21;
  uint uVar22;
  undefined8 *puVar23;
  long lVar24;
  undefined8 *puVar25;
  int iVar26;
  long lVar27;
  long lVar28;
  ulong uVar29;
  uint uVar30;
  ulong uVar31;
  bool bVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [32];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [16];
  undefined1 auVar52 [64];
  uint uVar53;
  uint uVar54;
  uint uVar55;
  undefined1 in_ZMM6 [64];
  undefined1 auVar56 [64];
  undefined1 in_ZMM7 [64];
  undefined1 auVar57 [64];
  _func_int **local_160;
  Mat local_138;
  ulong local_f0;
  ulong local_e8;
  uint local_dc;
  undefined8 local_d8;
  uint uStack_d0;
  uint uStack_cc;
  size_t local_c8;
  size_t local_c0;
  void *local_b8;
  ulong local_b0;
  undefined1 local_a8 [32];
  uint local_88;
  uint uStack_84;
  uint uStack_80;
  uint uStack_7c;
  Option opt_pack1;
  
  auVar35 = in_ZMM6._0_16_;
  auVar36 = in_ZMM7._0_16_;
  uVar30 = bottom_blob->c;
  uVar31 = (ulong)uVar30;
  local_138.elemsize = bottom_blob->elemsize;
  local_138.elempack = bottom_blob->elempack;
  local_138.dims = bottom_blob->dims;
  local_138.w = bottom_blob->w;
  local_138.h = bottom_blob->h;
  iVar10 = bottom_blob->d;
  local_138.d = bottom_blob->d;
  local_138.c = bottom_blob->c;
  if (local_138.elempack == 8) {
    local_f0 = uVar31;
    switch(local_138.dims) {
    case 1:
      p_Var15 = this->_vptr_Padding_x86_avx[-3];
      uVar30 = *(uint *)(&this->field_0xd8 + (long)p_Var15) + local_138.w * 8 +
               *(int *)(&this->field_0xdc + (long)p_Var15);
      bVar32 = (uVar30 & 7) == 0;
      if ((bVar32 && (*(uint *)(&this->field_0xd8 + (long)p_Var15) & 7) == 0) &&
         (*(int *)(&this->field_0xe0 + (long)p_Var15) == 0)) {
        Mat::create(top_blob,(int)uVar30 >> 3,(local_138.elemsize >> 3) << bVar32 * '\x03',8,
                    opt->blob_allocator);
        if ((Mat *)top_blob->data == (Mat *)0x0) {
          return -100;
        }
        if ((long)top_blob->c * top_blob->cstep != 0) {
          p_Var15 = this->_vptr_Padding_x86_avx[-3];
          uVar31 = (ulong)*(float *)(&this->field_0xe4 + (long)p_Var15);
          iVar10 = *(int *)(&this->field_0xd8 + (long)p_Var15);
          iVar9 = iVar10 + 7;
          if (-1 < iVar10) {
            iVar9 = iVar10;
          }
          iVar10 = *(int *)(&this->field_0xdc + (long)p_Var15);
          iVar7 = iVar10 + 7;
          if (-1 < iVar10) {
            iVar7 = iVar10;
          }
          padding_constant_pack8_int8_sse
                    ((ncnn *)bottom_blob,(Mat *)top_blob->data,(Mat *)(ulong)(uint)top_blob->w,0,0,
                     iVar9 >> 3,iVar7 >> 3,
                     uVar31 << 0x38 | uVar31 << 0x30 | uVar31 << 0x28 |
                     uVar31 << 0x20 | uVar31 << 0x18 | uVar31 << 0x10 | uVar31 << 8 | uVar31);
          return 0;
        }
        return -100;
      }
      break;
    case 2:
      p_Var15 = this->_vptr_Padding_x86_avx[-3];
      uVar30 = *(uint *)(&this->field_0xd0 + (long)p_Var15) + local_138.h * 8 +
               *(int *)(&this->field_0xd4 + (long)p_Var15);
      bVar32 = (uVar30 & 7) == 0;
      if ((bVar32 && (*(uint *)(&this->field_0xd0 + (long)p_Var15) & 7) == 0) &&
         (*(int *)(&this->field_0xe0 + (long)p_Var15) == 0)) {
        Mat::create(top_blob,local_138.w + *(int *)(&this->field_0xd8 + (long)p_Var15) +
                             *(int *)(&this->field_0xdc + (long)p_Var15),(int)uVar30 >> 3,
                    (local_138.elemsize >> 3) << bVar32 * '\x03',8,opt->blob_allocator);
        if ((Mat *)top_blob->data == (Mat *)0x0) {
          return -100;
        }
        if ((long)top_blob->c * top_blob->cstep != 0) {
          p_Var15 = this->_vptr_Padding_x86_avx[-3];
          uVar31 = (ulong)*(float *)(&this->field_0xe4 + (long)p_Var15);
          iVar10 = *(int *)(&this->field_0xd0 + (long)p_Var15);
          iVar9 = *(int *)(&this->field_0xd4 + (long)p_Var15);
          iVar7 = iVar10 + 7;
          if (-1 < iVar10) {
            iVar7 = iVar10;
          }
          iVar10 = iVar9 + 7;
          if (-1 < iVar9) {
            iVar10 = iVar9;
          }
          padding_constant_pack8_int8_sse
                    ((ncnn *)bottom_blob,(Mat *)top_blob->data,(Mat *)(ulong)(uint)top_blob->w,
                     iVar7 >> 3,iVar10 >> 3,*(int *)(&this->field_0xd8 + (long)p_Var15),
                     *(int *)(&this->field_0xdc + (long)p_Var15),
                     uVar31 << 0x38 | uVar31 << 0x30 | uVar31 << 0x28 |
                     uVar31 << 0x20 | uVar31 << 0x18 | uVar31 << 0x10 | uVar31 << 8 | uVar31);
          return 0;
        }
        return -100;
      }
      break;
    case 3:
      p_Var15 = this->_vptr_Padding_x86_avx[-3];
      uVar11 = *(uint *)(&this->field_0xe8 + (long)p_Var15) + uVar30 * 8 +
               *(int *)(&this->field_0xec + (long)p_Var15);
      bVar32 = (uVar11 & 7) == 0;
      if (bVar32 && (*(uint *)(&this->field_0xe8 + (long)p_Var15) & 7) == 0) {
        if ((uVar11 == uVar30 * 8) || (*(int *)(&this->field_0xe0 + (long)p_Var15) == 0)) {
          uVar11 = (int)uVar11 >> 3;
          Mat::create(top_blob,local_138.w + *(int *)(&this->field_0xd8 + (long)p_Var15) +
                               *(int *)(&this->field_0xdc + (long)p_Var15),
                      local_138.h + *(int *)(&this->field_0xd0 + (long)p_Var15) +
                      *(int *)(&this->field_0xd4 + (long)p_Var15),uVar11,
                      (local_138.elemsize >> 3) << bVar32 * '\x03',8,opt->blob_allocator);
          if (top_blob->data == (void *)0x0) {
            return -100;
          }
          if ((long)top_blob->c * top_blob->cstep == 0) {
            return -100;
          }
          local_160 = this->_vptr_Padding_x86_avx;
          iVar10 = *(int *)(&this->field_0xe8 + (long)local_160[-3]);
          iVar9 = iVar10 + 7;
          if (-1 < iVar10) {
            iVar9 = iVar10;
          }
          if ((int)uVar11 < 1) {
            return 0;
          }
          uVar30 = -(iVar9 >> 3);
          uVar12 = (ulong)uVar11;
          uVar29 = 0;
          auVar52 = ZEXT3264(_DAT_00316f00);
          uVar53 = 0;
          uVar54 = 0x80000000;
          uVar55 = 0;
          uVar22 = 0x80000000;
          auVar35 = vpcmpeqd_avx(auVar36,auVar36);
          auVar56 = ZEXT1664(auVar35);
          local_88 = 0;
          uStack_84 = 0x80000000;
          uStack_80 = 0;
          uStack_7c = 0x80000000;
          uVar11 = uVar30;
          local_dc = uVar30;
          local_b0 = uVar12;
          do {
            local_d8 = (ulong)uVar11;
            pvVar4 = top_blob->data;
            sVar5 = top_blob->elemsize;
            p_Var15 = local_160[-3];
            uVar16 = (ulong)*(float *)(&this->field_0xe4 + (long)p_Var15);
            sVar3 = top_blob->cstep;
            uVar16 = uVar16 << 0x38 | uVar16 << 0x30 | uVar16 << 0x28 |
                     uVar16 << 0x20 | uVar16 << 0x18 | uVar16 << 0x10 | uVar16 << 8 | uVar16;
            local_a8._0_8_ = uVar29;
            uVar20 = uVar30 + (int)uVar29;
            auVar35 = auVar56._0_16_;
            if ((int)uVar20 < 0 || (int)uVar31 <= (int)uVar20) {
              iVar10 = 1;
              if (top_blob->dims != 3) {
                iVar10 = top_blob->d;
              }
              uVar20 = top_blob->w * top_blob->h * iVar10;
              if ((int)uVar20 < 1) goto LAB_0029fa28;
              auVar33._8_8_ = 0;
              auVar33._0_8_ = (ulong)uVar20 - 1;
              auVar36 = vpshufd_avx(auVar33,0x44);
              auVar34._8_8_ = 0;
              auVar34._0_8_ = uVar16;
              auVar37 = vpshufd_avx(auVar34,0x44);
              auVar38._16_16_ = auVar37;
              auVar38._0_16_ = auVar37;
              auVar39._0_4_ = auVar36._0_4_ ^ uVar53;
              auVar39._4_4_ = auVar36._4_4_ ^ uVar54;
              auVar39._8_4_ = auVar36._8_4_ ^ uVar55;
              auVar39._12_4_ = auVar36._12_4_ ^ uVar22;
              auVar41._0_4_ = auVar36._0_4_ ^ uVar53;
              auVar41._4_4_ = auVar36._4_4_ ^ uVar54;
              auVar41._8_4_ = auVar36._8_4_ ^ uVar55;
              auVar41._12_4_ = auVar36._12_4_ ^ uVar22;
              uVar16 = 0;
              do {
                auVar46._8_8_ = 0;
                auVar46._0_8_ = uVar16;
                auVar36 = vpshufd_avx(auVar46,0x44);
                auVar49._16_16_ = auVar36;
                auVar49._0_16_ = auVar36;
                auVar44 = vorps_avx(auVar49,auVar52._0_32_);
                auVar51._0_4_ = auVar44._16_4_ ^ uVar53;
                auVar51._4_4_ = auVar44._20_4_ ^ uVar54;
                auVar51._8_4_ = auVar44._24_4_ ^ uVar55;
                auVar51._12_4_ = auVar44._28_4_ ^ uVar22;
                auVar36 = vpcmpgtq_avx(auVar51,auVar39);
                auVar47._0_4_ = auVar44._0_4_ ^ uVar53;
                auVar47._4_4_ = auVar44._4_4_ ^ uVar54;
                auVar47._8_4_ = auVar44._8_4_ ^ uVar55;
                auVar47._12_4_ = auVar44._12_4_ ^ uVar22;
                auVar37 = vpcmpgtq_avx(auVar47,auVar41);
                auVar50._16_16_ = auVar36 ^ auVar35;
                auVar50._0_16_ = auVar37 ^ auVar35;
                auVar44 = vmaskmovpd_avx(auVar50,auVar38);
                *(undefined1 (*) [32])((long)pvVar4 + uVar16 * 8 + sVar3 * sVar5 * uVar29) = auVar44
                ;
                uVar16 = uVar16 + 4;
                local_d8._0_4_ = uVar11;
              } while ((uVar20 + 3 & 0xfffffffc) != uVar16);
            }
            else {
              bVar32 = bottom_blob->dims == 3;
              local_138.c = 1;
              if (!bVar32) {
                local_138.c = bottom_blob->d;
              }
              pMVar13 = (Mat *)((long)pvVar4 + sVar3 * uVar29 * sVar5);
              iVar10 = bottom_blob->w;
              lVar14 = (long)iVar10;
              iVar9 = bottom_blob->h;
              local_138.dims = bVar32 ^ 3;
              local_b8 = bottom_blob->data;
              local_138.elemsize = bottom_blob->elemsize;
              local_c0 = bottom_blob->cstep;
              puVar25 = (undefined8 *)(uVar20 * local_c0 * local_138.elemsize + (long)local_b8);
              local_138.elempack = bottom_blob->elempack;
              local_138.allocator = bottom_blob->allocator;
              local_138.refcount = (int *)0x0;
              local_138.cstep = iVar9 * lVar14;
              local_138.d = 1;
              iVar7 = *(int *)(&this->field_0xe0 + (long)p_Var15);
              local_c8 = local_138.elemsize;
              if (iVar7 == 0) {
                local_138.data = puVar25;
                local_138.w = iVar10;
                local_138.h = iVar9;
                padding_constant_pack8_int8_sse
                          ((ncnn *)&local_138,pMVar13,(Mat *)(ulong)(uint)top_blob->w,
                           *(int *)(&this->field_0xd0 + (long)p_Var15),
                           *(int *)(&this->field_0xd4 + (long)p_Var15),
                           *(int *)(&this->field_0xd8 + (long)p_Var15),
                           *(int *)(&this->field_0xdc + (long)p_Var15),uVar16);
                auVar35 = vpcmpeqd_avx(auVar35,auVar35);
                auVar56 = ZEXT1664(auVar35);
                auVar52 = ZEXT3264(_DAT_00316f00);
                local_160 = this->_vptr_Padding_x86_avx;
                p_Var15 = local_160[-3];
                iVar7 = *(int *)(&this->field_0xe0 + (long)p_Var15);
                uVar53 = local_88;
                uVar54 = uStack_84;
                uVar55 = uStack_80;
                uVar22 = uStack_7c;
              }
              if (iVar7 == 1) {
                iVar7 = *(int *)(&this->field_0xd0 + (long)p_Var15);
                iVar1 = *(int *)(&this->field_0xd4 + (long)p_Var15);
                iVar8 = *(int *)(&this->field_0xd8 + (long)p_Var15);
                iVar2 = *(int *)(&this->field_0xdc + (long)p_Var15);
                pMVar17 = pMVar13;
                if (0 < iVar7) {
                  lVar19 = local_c0 * local_c8 * local_d8;
                  iVar21 = 0;
                  do {
                    if (0 < iVar8) {
                      pvVar4 = (void *)*puVar25;
                      iVar26 = iVar8;
                      do {
                        pMVar17->data = pvVar4;
                        pMVar17 = (Mat *)&pMVar17->refcount;
                        iVar26 = iVar26 + -1;
                      } while (iVar26 != 0);
                    }
                    puVar18 = puVar25;
                    if (0 < iVar10) {
                      lVar24 = 0;
                      lVar27 = 0;
                      do {
                        (&pMVar17->data)[lVar27] = *(void **)((long)local_b8 + lVar27 * 8 + lVar19);
                        lVar27 = lVar27 + 1;
                        lVar24 = lVar24 + -8;
                      } while (iVar10 != (int)lVar27);
                      pMVar17 = (Mat *)((long)pMVar17 - lVar24);
                      puVar18 = (undefined8 *)((long)local_b8 + (lVar19 - lVar24));
                    }
                    if (0 < iVar2) {
                      pvVar4 = (void *)puVar18[-1];
                      iVar26 = iVar2;
                      do {
                        pMVar17->data = pvVar4;
                        pMVar17 = (Mat *)&pMVar17->refcount;
                        iVar26 = iVar26 + -1;
                      } while (iVar26 != 0);
                    }
                    iVar21 = iVar21 + 1;
                  } while (iVar21 != iVar7);
                }
                puVar18 = puVar25;
                if (0 < iVar9) {
                  iVar7 = 0;
                  do {
                    if (0 < iVar8) {
                      pvVar4 = (void *)*puVar18;
                      iVar21 = iVar8;
                      do {
                        pMVar17->data = pvVar4;
                        pMVar17 = (Mat *)&pMVar17->refcount;
                        iVar21 = iVar21 + -1;
                      } while (iVar21 != 0);
                    }
                    if (0 < iVar10) {
                      lVar19 = 0;
                      lVar24 = 0;
                      do {
                        (&pMVar17->data)[lVar24] = (void *)puVar18[lVar24];
                        lVar24 = lVar24 + 1;
                        lVar19 = lVar19 + -8;
                      } while (iVar10 != (int)lVar24);
                      pMVar17 = (Mat *)((long)pMVar17 - lVar19);
                      puVar18 = (undefined8 *)((long)puVar18 - lVar19);
                    }
                    if (0 < iVar2) {
                      pvVar4 = (void *)puVar18[-1];
                      iVar21 = iVar2;
                      do {
                        pMVar17->data = pvVar4;
                        pMVar17 = (Mat *)&pMVar17->refcount;
                        iVar21 = iVar21 + -1;
                      } while (iVar21 != 0);
                    }
                    iVar7 = iVar7 + 1;
                  } while (iVar7 != iVar9);
                }
                if (0 < iVar1) {
                  puVar18 = puVar18 + -lVar14;
                  iVar7 = 0;
                  do {
                    if (0 < iVar8) {
                      pvVar4 = (void *)*puVar18;
                      iVar21 = iVar8;
                      do {
                        pMVar17->data = pvVar4;
                        pMVar17 = (Mat *)&pMVar17->refcount;
                        iVar21 = iVar21 + -1;
                      } while (iVar21 != 0);
                    }
                    puVar23 = puVar18;
                    if (0 < iVar10) {
                      lVar19 = 0;
                      lVar24 = 0;
                      do {
                        (&pMVar17->data)[lVar24] = (void *)puVar18[lVar24];
                        lVar24 = lVar24 + 1;
                        lVar19 = lVar19 + -8;
                      } while (iVar10 != (int)lVar24);
                      pMVar17 = (Mat *)((long)pMVar17 - lVar19);
                      puVar23 = (undefined8 *)((long)puVar18 - lVar19);
                    }
                    if (0 < iVar2) {
                      pvVar4 = (void *)puVar23[-1];
                      iVar21 = iVar2;
                      do {
                        pMVar17->data = pvVar4;
                        pMVar17 = (Mat *)&pMVar17->refcount;
                        iVar21 = iVar21 + -1;
                      } while (iVar21 != 0);
                    }
                    iVar7 = iVar7 + 1;
                  } while (iVar7 != iVar1);
                }
              }
              p_Var15 = local_160[-3];
              uVar12 = local_b0;
              uVar31 = local_f0;
              uVar30 = local_dc;
              if (*(int *)(&this->field_0xe0 + (long)p_Var15) == 2) {
                iVar7 = *(int *)(&this->field_0xd0 + (long)p_Var15);
                iVar1 = *(int *)(&this->field_0xd4 + (long)p_Var15);
                uVar11 = *(uint *)(&this->field_0xd8 + (long)p_Var15);
                lVar24 = (long)(int)uVar11;
                uVar29 = (ulong)uVar11;
                uVar20 = *(uint *)(&this->field_0xdc + (long)p_Var15);
                uVar16 = (ulong)uVar20;
                lVar19 = (long)(iVar10 * iVar7);
                local_e8 = CONCAT44(local_e8._4_4_,iVar7);
                if (iVar7 < 1) {
                  puVar25 = puVar25 + lVar19;
                }
                else {
                  lVar27 = local_c0 * local_c8 * local_d8;
                  lVar28 = lVar27 + lVar24 * 8 + lVar19 * 8 + (long)local_b8;
                  puVar25 = (undefined8 *)(lVar27 + lVar19 * 8 + (long)local_b8);
                  iVar8 = 0;
                  do {
                    if (0 < (int)uVar11) {
                      lVar19 = 0;
                      do {
                        pMVar13->data = *(void **)(lVar28 + lVar19 * 8);
                        pMVar13 = (Mat *)&pMVar13->refcount;
                        lVar19 = lVar19 + -1;
                      } while (-lVar19 != uVar29);
                    }
                    puVar18 = puVar25;
                    if (0 < iVar10) {
                      lVar27 = 0;
                      lVar19 = 0;
                      do {
                        (&pMVar13->data)[lVar19] = (void *)puVar25[lVar19];
                        lVar19 = lVar19 + 1;
                        lVar27 = lVar27 + -8;
                      } while (iVar10 != (int)lVar19);
                      pMVar13 = (Mat *)((long)pMVar13 - lVar27);
                      puVar18 = (undefined8 *)((long)puVar25 - lVar27);
                    }
                    if (0 < (int)uVar20) {
                      lVar19 = 0;
                      do {
                        pMVar13->data = (void *)puVar18[lVar19 + -2];
                        pMVar13 = (Mat *)&pMVar13->refcount;
                        lVar19 = lVar19 + -1;
                      } while (-lVar19 != uVar16);
                    }
                    puVar25 = puVar25 + -lVar14;
                    iVar8 = iVar8 + 1;
                    lVar28 = lVar28 + lVar14 * -8;
                  } while (iVar8 != iVar7);
                }
                if (0 < iVar9) {
                  iVar7 = 0;
                  do {
                    if (0 < (int)uVar11) {
                      lVar19 = 0;
                      do {
                        pMVar13->data = (void *)puVar25[lVar24 + lVar19];
                        pMVar13 = (Mat *)&pMVar13->refcount;
                        lVar19 = lVar19 + -1;
                      } while (-lVar19 != uVar29);
                    }
                    if (0 < iVar10) {
                      lVar19 = 0;
                      lVar27 = 0;
                      do {
                        (&pMVar13->data)[lVar27] = (void *)puVar25[lVar27];
                        lVar27 = lVar27 + 1;
                        lVar19 = lVar19 + -8;
                      } while (iVar10 != (int)lVar27);
                      pMVar13 = (Mat *)((long)pMVar13 - lVar19);
                      puVar25 = (undefined8 *)((long)puVar25 - lVar19);
                    }
                    if (0 < (int)uVar20) {
                      lVar19 = 0;
                      do {
                        pMVar13->data = (void *)puVar25[lVar19 + -2];
                        pMVar13 = (Mat *)&pMVar13->refcount;
                        lVar19 = lVar19 + -1;
                      } while (-lVar19 != uVar16);
                    }
                    iVar7 = iVar7 + 1;
                  } while (iVar7 != iVar9);
                }
                if (0 < iVar1) {
                  puVar18 = puVar25 + -(long)(iVar10 * 2);
                  puVar25 = puVar25 + (lVar24 - iVar10 * 2);
                  iVar9 = 0;
                  do {
                    if (0 < (int)uVar11) {
                      lVar19 = 0;
                      do {
                        pMVar13->data = (void *)puVar25[lVar19];
                        pMVar13 = (Mat *)&pMVar13->refcount;
                        lVar19 = lVar19 + -1;
                      } while (-lVar19 != uVar29);
                    }
                    puVar23 = puVar18;
                    if (0 < iVar10) {
                      lVar24 = 0;
                      lVar19 = 0;
                      do {
                        (&pMVar13->data)[lVar19] = (void *)puVar18[lVar19];
                        lVar19 = lVar19 + 1;
                        lVar24 = lVar24 + -8;
                      } while (iVar10 != (int)lVar19);
                      pMVar13 = (Mat *)((long)pMVar13 - lVar24);
                      puVar23 = (undefined8 *)((long)puVar18 - lVar24);
                    }
                    if (0 < (int)uVar20) {
                      lVar19 = 0;
                      do {
                        pMVar13->data = (void *)puVar23[lVar19 + -2];
                        pMVar13 = (Mat *)&pMVar13->refcount;
                        lVar19 = lVar19 + -1;
                      } while (-lVar19 != uVar16);
                    }
                    puVar18 = puVar18 + -lVar14;
                    iVar9 = iVar9 + 1;
                    puVar25 = puVar25 + -lVar14;
                  } while (iVar9 != iVar1);
                }
              }
LAB_0029fa28:
              uVar29 = local_a8._0_8_;
            }
            uVar29 = uVar29 + 1;
            uVar11 = (uint)local_d8 + 1;
            if (uVar29 == uVar12) {
              return 0;
            }
          } while( true );
        }
      }
      break;
    case 4:
      p_Var15 = this->_vptr_Padding_x86_avx[-3];
      if (*(int *)(&this->field_0xe0 + (long)p_Var15) == 0) {
        uVar11 = *(int *)(&this->field_0xe8 + (long)p_Var15) + iVar10 +
                 *(int *)(&this->field_0xec + (long)p_Var15);
        Mat::create(top_blob,local_138.w + *(int *)(&this->field_0xd8 + (long)p_Var15) +
                             *(int *)(&this->field_0xdc + (long)p_Var15),
                    local_138.h + *(int *)(&this->field_0xd0 + (long)p_Var15) +
                    *(int *)(&this->field_0xd4 + (long)p_Var15),uVar11,uVar30,local_138.elemsize,8,
                    opt->blob_allocator);
        if (top_blob->data == (void *)0x0) {
          return -100;
        }
        if ((long)top_blob->c * top_blob->cstep != 0) {
          if ((int)uVar30 < 1) {
            return 0;
          }
          uVar31 = 0;
          auVar52 = ZEXT3264(_DAT_00316f00);
          uVar30 = 0;
          uVar53 = 0x80000000;
          uVar54 = 0;
          uVar55 = 0x80000000;
          auVar35 = vpcmpeqd_avx(auVar35,auVar35);
          auVar56 = ZEXT1664(auVar35);
          local_d8 = 0x8000000000000000;
          uStack_d0 = 0;
          uStack_cc = 0x80000000;
          do {
            if (0 < (int)uVar11) {
              local_e8 = (ulong)*(float *)(&this->field_0xe4 + (long)this->_vptr_Padding_x86_avx[-3]
                                          );
              local_e8 = local_e8 << 0x38 | local_e8 << 0x30 | local_e8 << 0x28 |
                         local_e8 << 0x20 | local_e8 << 0x18 | local_e8 << 0x10 | local_e8 << 8 |
                         local_e8;
              auVar35._8_8_ = 0;
              auVar35._0_8_ = local_e8;
              auVar35 = vpshufd_avx(auVar35,0x44);
              local_a8._16_16_ = auVar35;
              local_a8._0_16_ = auVar35;
              auVar57 = ZEXT3264(local_a8);
              uVar29 = 0;
              do {
                pMVar13 = (Mat *)(long)top_blob->w;
                iVar9 = top_blob->h;
                pvVar4 = top_blob->data;
                sVar5 = top_blob->elemsize;
                lVar19 = top_blob->cstep * uVar31;
                lVar14 = (long)iVar9 * (long)pMVar13;
                p_Var15 = this->_vptr_Padding_x86_avx[-3];
                uVar22 = (int)uVar29 - *(int *)(&this->field_0xe8 + (long)p_Var15);
                auVar35 = auVar56._0_16_;
                if ((int)uVar22 < 0 || iVar10 <= (int)uVar22) {
                  uVar22 = (uint)lVar14;
                  if (0 < (int)uVar22) {
                    auVar36._8_8_ = 0;
                    auVar36._0_8_ = (ulong)(uVar22 & 0x7fffffff) - 1;
                    auVar36 = vpshufd_avx(auVar36,0x44);
                    auVar37._0_4_ = auVar36._0_4_ ^ uVar30;
                    auVar37._4_4_ = auVar36._4_4_ ^ uVar53;
                    auVar37._8_4_ = auVar36._8_4_ ^ uVar54;
                    auVar37._12_4_ = auVar36._12_4_ ^ uVar55;
                    auVar40._0_4_ = auVar36._0_4_ ^ uVar30;
                    auVar40._4_4_ = auVar36._4_4_ ^ uVar53;
                    auVar40._8_4_ = auVar36._8_4_ ^ uVar54;
                    auVar40._12_4_ = auVar36._12_4_ ^ uVar55;
                    uVar12 = 0;
                    do {
                      auVar42._8_8_ = 0;
                      auVar42._0_8_ = uVar12;
                      auVar36 = vpshufd_avx(auVar42,0x44);
                      auVar44._16_16_ = auVar36;
                      auVar44._0_16_ = auVar36;
                      auVar44 = vorps_avx(auVar44,auVar52._0_32_);
                      auVar48._0_4_ = auVar44._16_4_ ^ uVar30;
                      auVar48._4_4_ = auVar44._20_4_ ^ uVar53;
                      auVar48._8_4_ = auVar44._24_4_ ^ uVar54;
                      auVar48._12_4_ = auVar44._28_4_ ^ uVar55;
                      auVar36 = vpcmpgtq_avx(auVar48,auVar37);
                      auVar43._0_4_ = auVar44._0_4_ ^ uVar30;
                      auVar43._4_4_ = auVar44._4_4_ ^ uVar53;
                      auVar43._8_4_ = auVar44._8_4_ ^ uVar54;
                      auVar43._12_4_ = auVar44._12_4_ ^ uVar55;
                      auVar42 = vpcmpgtq_avx(auVar43,auVar40);
                      auVar45._16_16_ = auVar36 ^ auVar35;
                      auVar45._0_16_ = auVar42 ^ auVar35;
                      auVar44 = vmaskmovpd_avx(auVar45,auVar57._0_32_);
                      *(undefined1 (*) [32])
                       ((long)pvVar4 +
                       uVar12 * 8 + sVar5 * ((long)iVar9 * uVar29 * (long)pMVar13 + lVar19)) =
                           auVar44;
                      uVar12 = uVar12 + 4;
                    } while ((uVar22 + 3 & 0xfffffffc) != uVar12);
                  }
                }
                else {
                  local_138.w = bottom_blob->w;
                  local_138.elemsize = bottom_blob->elemsize;
                  local_138.h = bottom_blob->h;
                  local_138.cstep = (long)local_138.h * (long)local_138.w;
                  local_138.elempack = bottom_blob->elempack;
                  local_138.data =
                       (void *)((long)bottom_blob->data +
                               local_138.elemsize * local_138.cstep * (ulong)uVar22 +
                               bottom_blob->cstep * uVar31 * local_138.elemsize);
                  local_138.allocator = bottom_blob->allocator;
                  local_138.refcount = (int *)0x0;
                  local_138.dims = 2;
                  local_138.d = 1;
                  local_138.c = 1;
                  padding_constant_pack8_int8_sse
                            ((ncnn *)&local_138,
                             (Mat *)((long)pvVar4 + lVar14 * sVar5 * uVar29 + lVar19 * sVar5),
                             pMVar13,*(int *)(&this->field_0xd0 + (long)p_Var15),
                             *(int *)(&this->field_0xd4 + (long)p_Var15),
                             *(int *)(&this->field_0xd8 + (long)p_Var15),
                             *(int *)(&this->field_0xdc + (long)p_Var15),local_e8);
                  auVar57 = ZEXT3264(local_a8);
                  auVar35 = vpcmpeqd_avx(auVar35,auVar35);
                  auVar56 = ZEXT1664(auVar35);
                  auVar52 = ZEXT3264(_DAT_00316f00);
                  uVar30 = (uint)local_d8;
                  uVar53 = local_d8._4_4_;
                  uVar54 = uStack_d0;
                  uVar55 = uStack_cc;
                }
                uVar29 = uVar29 + 1;
              } while (uVar29 != uVar11);
            }
            uVar31 = uVar31 + 1;
          } while (uVar31 != local_f0);
          return 0;
        }
        return -100;
      }
    }
  }
  piVar6 = bottom_blob->refcount;
  local_138.data = bottom_blob->data;
  local_138.refcount = bottom_blob->refcount;
  local_138.allocator = bottom_blob->allocator;
  local_138.cstep = bottom_blob->cstep;
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + 1;
    UNLOCK();
  }
  if (local_138.elempack != 1) {
    opt_pack1.lightmode = opt->lightmode;
    opt_pack1._1_3_ = *(undefined3 *)&opt->field_0x1;
    opt_pack1.num_threads = opt->num_threads;
    opt_pack1.workspace_allocator = opt->workspace_allocator;
    opt_pack1.openmp_blocktime = opt->openmp_blocktime;
    opt_pack1.use_winograd_convolution = opt->use_winograd_convolution;
    opt_pack1.use_sgemm_convolution = opt->use_sgemm_convolution;
    opt_pack1.use_int8_inference = opt->use_int8_inference;
    opt_pack1.use_vulkan_compute = opt->use_vulkan_compute;
    opt_pack1.use_bf16_storage = opt->use_bf16_storage;
    opt_pack1.use_fp16_packed = opt->use_fp16_packed;
    opt_pack1.use_fp16_storage = opt->use_fp16_storage;
    opt_pack1.use_fp16_arithmetic = opt->use_fp16_arithmetic;
    opt_pack1.use_int8_packed = opt->use_int8_packed;
    opt_pack1.use_int8_storage = opt->use_int8_storage;
    opt_pack1.use_int8_arithmetic = opt->use_int8_arithmetic;
    opt_pack1.use_packing_layout = opt->use_packing_layout;
    opt_pack1.use_shader_pack8 = opt->use_shader_pack8;
    opt_pack1.use_subgroup_basic = opt->use_subgroup_basic;
    opt_pack1.use_subgroup_vote = opt->use_subgroup_vote;
    opt_pack1.use_subgroup_ballot = opt->use_subgroup_ballot;
    opt_pack1.use_subgroup_shuffle = opt->use_subgroup_shuffle;
    opt_pack1.use_image_storage = opt->use_image_storage;
    opt_pack1.use_tensor_storage = opt->use_tensor_storage;
    opt_pack1.use_weight_fp16_storage = opt->use_weight_fp16_storage;
    opt_pack1.flush_denormals = opt->flush_denormals;
    opt_pack1.use_local_pool_allocator = opt->use_local_pool_allocator;
    opt_pack1.use_reserved_1 = opt->use_reserved_1;
    opt_pack1.use_reserved_2 = opt->use_reserved_2;
    opt_pack1.use_reserved_3 = opt->use_reserved_3;
    opt_pack1.use_reserved_4 = opt->use_reserved_4;
    opt_pack1.use_reserved_5 = opt->use_reserved_5;
    opt_pack1.use_reserved_6 = opt->use_reserved_6;
    opt_pack1.use_reserved_7 = opt->use_reserved_7;
    opt_pack1.use_reserved_8 = opt->use_reserved_8;
    opt_pack1.use_reserved_9 = opt->use_reserved_9;
    opt_pack1.use_reserved_10 = opt->use_reserved_10;
    opt_pack1.use_reserved_11 = opt->use_reserved_11;
    opt_pack1.blob_allocator = opt->workspace_allocator;
    convert_packing(bottom_blob,&local_138,1,&opt_pack1);
  }
  iVar10 = Padding::forward((Padding *)
                            ((long)&this->_vptr_Padding_x86_avx +
                            (long)this->_vptr_Padding_x86_avx[-3]),&local_138,top_blob,opt);
  if (local_138.refcount != (int *)0x0) {
    LOCK();
    *local_138.refcount = *local_138.refcount + -1;
    UNLOCK();
    if (*local_138.refcount == 0) {
      if (local_138.allocator == (Allocator *)0x0) {
        if (local_138.data != (void *)0x0) {
          free(local_138.data);
        }
      }
      else {
        (*(local_138.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar10;
}

Assistant:

int Padding_x86_avx::forward_int8(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

#if __SSE2__
    if (elempack == 8)
    {
        if (dims == 1)
        {
            int outw = w * elempack + left + right;

            int out_elempack = outw % 8 == 0 ? 8 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (left % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int64_t v8 = (int64_t)value;
                int64_t pad_value = v8 | (v8 << 8) | (v8 << 16) | (v8 << 24) | (v8 << 32) | (v8 << 40) | (v8 << 48) | (v8 << 56);
                padding_constant_pack8_int8_sse(bottom_blob, top_blob, 0, 0, left / 8, right / 8, pad_value);

                return 0;
            }
        }

        if (dims == 2)
        {
            int outw = w + left + right;
            int outh = h * elempack + top + bottom;

            int out_elempack = outh % 8 == 0 ? 8 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (top % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int64_t v8 = (int64_t)value;
                int64_t pad_value = v8 | (v8 << 8) | (v8 << 16) | (v8 << 24) | (v8 << 32) | (v8 << 40) | (v8 << 48) | (v8 << 56);
                padding_constant_pack8_int8_sse(bottom_blob, top_blob, top / 8, bottom / 8, left, right, pad_value);

                return 0;
            }
        }

        if (dims == 3)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outc = channels * elempack + front + behind;

            int out_elempack = outc % 8 == 0 ? 8 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (front % 8 == 0 && out_elempack == 8 && !(outc != channels * elempack && type != 0))
            {
                top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int front_ = front / elempack;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < outc / out_elempack; q++)
                {
                    Mat borderm = top_blob.channel(q);

                    // TODO perchannel
                    //                     int64_t pad_value = per_channel_pad_data_size ? vld1_s8(per_channel_pad_data + q * 8) : vdup_n_s8((signed char)value);
                    int64_t v8 = (int64_t)value;
                    int64_t pad_value = v8 | (v8 << 8) | (v8 << 16) | (v8 << 24) | (v8 << 32) | (v8 << 40) | (v8 << 48) | (v8 << 56);

                    //Channel padding
                    if ((q - front_) < 0 || (q - front_) >= channels)
                    {
                        borderm.fill<int64_t>(pad_value);
                    }
                    else
                    {
                        const Mat m = bottom_blob.channel(q - front_);
                        if (type == 0)
                            padding_constant_pack8_int8_sse(m, borderm, top, bottom, left, right, pad_value);
                        if (type == 1)
                            padding_replicate_pack8_int8_sse(m, borderm, top, bottom, left, right);
                        if (type == 2)
                            padding_reflect_pack8_int8_sse(m, borderm, top, bottom, left, right);
                    }
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outd = d + front + behind;

            if (type == 0)
            {
                top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    // TODO perchannel
                    //                     int64_t pad_value = per_channel_pad_data_size ? vld1_s8(per_channel_pad_data + q * 8) : vdup_n_s8((signed char)value);
                    int64_t v8 = (int64_t)value;
                    int64_t pad_value = v8 | (v8 << 8) | (v8 << 16) | (v8 << 24) | (v8 << 32) | (v8 << 40) | (v8 << 48) | (v8 << 56);

                    for (int z = 0; z < outd; z++)
                    {
                        Mat borderm = top_blob.channel(q).depth(z);

                        // depth padding
                        if ((z - front) < 0 || (z - front) >= d)
                        {
                            borderm.fill<int64_t>(pad_value);
                        }
                        else
                        {
                            const Mat m = bottom_blob.channel(q).depth(z - front);
                            padding_constant_pack8_int8_sse(m, borderm, top, bottom, left, right, pad_value);
                        }
                    }
                }

                return 0;
            }
        }
    }
#endif // __SSE2__

    Mat bottom_blob_unpacked = bottom_blob;
    if (elempack != 1)
    {
        Option opt_pack1 = opt;
        opt_pack1.blob_allocator = opt.workspace_allocator;

        convert_packing(bottom_blob, bottom_blob_unpacked, 1, opt_pack1);
    }

    return Padding::forward(bottom_blob_unpacked, top_blob, opt);
}